

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O3

void __thiscall InterpTest_HostFunc_Test::TestBody(InterpTest_HostFunc_Test *this)

{
  Store *this_00;
  size_t sVar1;
  int line;
  Type type;
  char *pcVar2;
  Result result;
  Values results;
  undefined1 local_170 [8];
  Store *local_168;
  Index local_160;
  AssertHelper local_158;
  Result local_14c;
  Values local_148;
  RefVec local_128;
  RefPtr<wabt::interp::HostFunc> local_110;
  Ptr local_f8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_d8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_b8;
  FuncType local_98;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  local_110.obj_ = (HostFunc *)operator_new(0x31);
  local_110.store_ =
       (Store *)((long)&((local_110.obj_)->super_Func).super_Extern.super_Object.host_info_ + 1);
  ((local_110.obj_)->super_Func).super_Extern.super_Object._vptr_Object = (_func_int **)0x16d736100;
  *(undefined8 *)&((local_110.obj_)->super_Func).super_Extern.super_Object.kind_ =
       0x7f017f0160020a01;
  *(undefined8 *)
   &((local_110.obj_)->super_Func).super_Extern.super_Object.finalizer_.super__Function_base.
    _M_functor = 0x106027f010060;
  *(undefined8 *)
   ((long)&((local_110.obj_)->super_Func).super_Extern.super_Object.finalizer_.super__Function_base.
           _M_functor + 8) = 0x101020300006601;
  ((local_110.obj_)->super_Func).super_Extern.super_Object.finalizer_.super__Function_base.
  _M_manager = (_Manager_type)0xa01006701010507;
  ((local_110.obj_)->super_Func).super_Extern.super_Object.finalizer_._M_invoker =
       (_Invoker_type)0x10014100060108;
  *(undefined1 *)&((local_110.obj_)->super_Func).super_Extern.super_Object.host_info_ = 0xb;
  local_110.root_index_ = (Index)local_110.store_;
  InterpTest::ReadModule
            (&this->super_InterpTest,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_110);
  if (local_110.obj_ != (HostFunc *)0x0) {
    operator_delete(local_110.obj_,local_110.root_index_ - (long)local_110.obj_);
  }
  this_00 = &(this->super_InterpTest).store_;
  local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  (local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
   super__Vector_impl_data._M_start)->enum_ = I32;
  (local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
   super__Vector_impl_data._M_start)->type_index_ = 0;
  local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  (local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
   super__Vector_impl_data._M_start)->enum_ = I32;
  (local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
   super__Vector_impl_data._M_start)->type_index_ = 0;
  local_98.super_ExternType.kind = First;
  local_98.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00246130;
  local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_98.params,&local_b8);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_98.results,&local_d8);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc:282:21)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc:282:21)>
             ::_M_manager;
  wabt::interp::Store::
  Alloc<wabt::interp::HostFunc,wabt::interp::Store&,wabt::interp::FuncType&,std::function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>&>
            (&local_110,this_00,this_00,&local_98,
             (function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
              *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  local_98.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00246130;
  if (local_98.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  sVar1 = ((local_110.obj_)->super_Func).super_Extern.super_Object.self_.index;
  local_128.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_128.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_128.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  (local_128.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
   super__Vector_impl_data._M_start)->index = sVar1;
  local_128.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_128.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
       super__Vector_impl_data._M_finish;
  InterpTest::Instantiate(&this->super_InterpTest,&local_128);
  if (local_128.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_128.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.root_index_ = 0;
  local_f8.obj_ = (Trap *)0x0;
  local_f8.store_ = (Store *)0x0;
  InterpTest::GetFuncExport((Ptr *)local_170,&this->super_InterpTest,0);
  local_148.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14c = wabt::interp::Func::Call
                        ((Func *)CONCAT71(local_170._1_7_,local_170[0]),this_00,&local_148,
                         (Values *)&local_128,&local_f8,(Stream *)0x0);
  if (local_148.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (CONCAT71(local_170._1_7_,local_170[0]) != 0) {
    wabt::interp::Store::DeleteRoot(local_168,local_160);
  }
  local_148.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_148.
                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            ((internal *)local_170,"Result::Ok","result",(Enum *)&local_148,&local_14c);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_148);
    if (local_168 == (Store *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)&local_168->features_;
    }
    type = kFatalFailure;
    line = 0x126;
  }
  else {
    if (local_168 != (Store *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
    }
    local_158.data_._0_4_ = 1;
    local_148.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)local_128.
                         super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_128.
                         super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 4);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_170,"1u","results.size()",(uint *)&local_158,
               (unsigned_long *)&local_148);
    if (local_170[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_148);
      if (local_168 == (Store *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)&local_168->features_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
                 ,0x127,pcVar2);
      testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_158);
      if (local_148.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(((local_148.
                       super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0).i64_ + 8))();
      }
    }
    if (local_168 != (Store *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
    }
    local_148.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_148.
                           super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
    local_158.data_._0_4_ =
         (undefined4)
         (local_128.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
          _M_impl.super__Vector_impl_data._M_start)->index;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)local_170,"2u","results[0].Get<u32>()",(uint *)&local_148,
               (uint *)&local_158);
    if (local_170[0] != (internal)0x0) goto LAB_00140195;
    testing::Message::Message((Message *)&local_148);
    if (local_168 == (Store *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)&local_168->features_;
    }
    type = kNonFatalFailure;
    line = 0x128;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_158,type,
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
             ,line,pcVar2);
  testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_148);
  testing::internal::AssertHelper::~AssertHelper(&local_158);
  if (local_148.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(((local_148.
                   super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                   _M_impl.super__Vector_impl_data._M_start)->field_0).i64_ + 8))();
  }
LAB_00140195:
  if (local_168 != (Store *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
  }
  if (local_f8.obj_ != (Trap *)0x0) {
    wabt::interp::Store::DeleteRoot(local_f8.store_,local_f8.root_index_);
  }
  if (local_128.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_110.obj_ != (HostFunc *)0x0) {
    wabt::interp::Store::DeleteRoot(local_110.store_,local_110.root_index_);
  }
  return;
}

Assistant:

TEST_F(InterpTest, HostFunc) {
  // (import "" "f" (func $f (param i32) (result i32)))
  // (func (export "g") (result i32)
  //   (call $f (i32.const 1)))
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x0a,
      0x02, 0x60, 0x01, 0x7f, 0x01, 0x7f, 0x60, 0x00, 0x01, 0x7f,
      0x02, 0x06, 0x01, 0x00, 0x01, 0x66, 0x00, 0x00, 0x03, 0x02,
      0x01, 0x01, 0x07, 0x05, 0x01, 0x01, 0x67, 0x00, 0x01, 0x0a,
      0x08, 0x01, 0x06, 0x00, 0x41, 0x01, 0x10, 0x00, 0x0b,
  });

  auto host_func =
      HostFunc::New(store_, FuncType{{ValueType::I32}, {ValueType::I32}},
                    [](Thread& thread, const Values& params, Values& results,
                       Trap::Ptr* out_trap) -> Result {
                      results[0] = Value::Make(params[0].Get<u32>() + 1);
                      return Result::Ok;
                    });

  Instantiate({host_func->self()});

  Values results;
  Trap::Ptr trap;
  Result result = GetFuncExport(0)->Call(store_, {}, results, &trap);

  ASSERT_EQ(Result::Ok, result);
  EXPECT_EQ(1u, results.size());
  EXPECT_EQ(2u, results[0].Get<u32>());
}